

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void tests::nested_to_dot(void)

{
  NS *this;
  ostream *poVar1;
  NS *pNVar2;
  type *h;
  type *g;
  type *_;
  type *f;
  NS *in_stack_00000110;
  
  test_graphs::simple();
  std::get<0ul,NS*,NS*>((tuple<NS_*,_NS_*> *)0x17b978);
  this = (NS *)std::get<1ul,NS*,NS*>((tuple<NS_*,_NS_*> *)0x17b987);
  test_graphs::two_nested();
  std::get<0ul,NS*>((tuple<NS_*> *)0x17b9a0);
  test_graphs::double_nested();
  std::get<0ul,NS*>((tuple<NS_*> *)0x17b9b9);
  poVar1 = std::operator<<((ostream *)&std::cout,"digraph g {");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"compound=true;");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"overlap = false;\nsplines = true;");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  draw_nested(in_stack_00000110);
  draw_nested(in_stack_00000110);
  draw_nested(in_stack_00000110);
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pNVar2 = NS::clear(this);
  if (pNVar2 != (NS *)0x0) {
    NS::~NS((NS *)0x17ba8d);
    operator_delete(pNVar2,0x18);
  }
  NS::clear(this);
  NS::clear(this);
  return;
}

Assistant:

void nested_to_dot() {
        auto [f, _] = test_graphs::simple();
        auto [g] = test_graphs::two_nested();
        auto [h] = test_graphs::double_nested();

        cout << "digraph g {" << endl;
        cout << "compound=true;" << endl;
        cout << "overlap = false;\nsplines = true;" << endl;
        draw_nested(f);
        draw_nested(g);
        draw_nested(h);
        cout << "}" << endl;

        delete f->clear(), g->clear(), h->clear();
    }